

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O0

int default_setup_cipher
              (quicly_crypto_engine_t *engine,quicly_conn_t *conn,size_t epoch,int is_enc,
              ptls_cipher_context_t **hp_ctx,ptls_aead_context_t **aead_ctx,
              ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,void *secret)

{
  ptls_iovec_t hash_value;
  ptls_cipher_context_t *ppVar1;
  ptls_aead_context_t *ppVar2;
  long *in_R8;
  long *in_R9;
  ptls_iovec_t pVar3;
  ptls_iovec_t pVar4;
  long in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  int ret;
  uint8_t hpkey [32];
  undefined1 *outlen;
  void *output;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  ptls_cipher_algorithm_t *in_stack_ffffffffffffff88;
  undefined4 uVar5;
  int in_stack_ffffffffffffff94;
  ptls_hash_algorithm_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  
  if (in_R8 != (long *)0x0) {
    *in_R8 = 0;
  }
  *in_R9 = 0;
  if (in_R8 != (long *)0x0) {
    outlen = &stack0xffffffffffffffa8;
    output = *(void **)(*(long *)(in_stack_00000008 + 0x18) + 8);
    pVar3 = ptls_iovec_init(in_stack_00000018,*(size_t *)(in_stack_00000010 + 8));
    uVar5 = pVar3.base._0_4_;
    in_stack_ffffffffffffff94 = pVar3.base._4_4_;
    in_stack_ffffffffffffff98 = (ptls_hash_algorithm_t *)pVar3.len;
    pVar4 = ptls_iovec_init((void *)0x0,0);
    in_stack_ffffffffffffff80 = pVar4.base._0_4_;
    in_stack_ffffffffffffff84 = pVar4.base._4_4_;
    in_stack_ffffffffffffff88 = (ptls_cipher_algorithm_t *)pVar4.len;
    pVar3.len._0_4_ = uVar5;
    pVar3.base = (uint8_t *)in_stack_ffffffffffffff88;
    pVar3.len._4_4_ = in_stack_ffffffffffffff94;
    hash_value.base._4_4_ = in_stack_ffffffffffffffa4;
    hash_value.base._0_4_ = in_stack_ffffffffffffffa0;
    hash_value.len = in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffffa4 =
         ptls_hkdf_expand_label
                   ((ptls_hash_algorithm_t *)pVar4.base,output,(size_t)outlen,pVar3,
                    in_stack_00000010,hash_value,in_stack_ffffffffffffffb0);
    if (in_stack_ffffffffffffffa4 != 0) goto LAB_0012da2d;
    ppVar1 = ptls_cipher_new(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,output);
    *in_R8 = (long)ppVar1;
    if (ppVar1 == (ptls_cipher_context_t *)0x0) {
      in_stack_ffffffffffffffa4 = 0x201;
      goto LAB_0012da2d;
    }
  }
  ppVar2 = ptls_aead_new((ptls_aead_algorithm_t *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff88,
                         (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  *in_R9 = (long)ppVar2;
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    in_stack_ffffffffffffffa4 = 0x201;
  }
  else {
    in_stack_ffffffffffffffa4 = 0;
  }
LAB_0012da2d:
  if (in_stack_ffffffffffffffa4 != 0) {
    if (*in_R9 != 0) {
      ptls_aead_free((ptls_aead_context_t *)0x12da52);
      *in_R9 = 0;
    }
    if ((in_R8 != (long *)0x0) && (*in_R8 != 0)) {
      ptls_cipher_free((ptls_cipher_context_t *)0x12da8a);
      *in_R8 = 0;
    }
  }
  (*ptls_clear_memory)(&stack0xffffffffffffffa8,0x20);
  return in_stack_ffffffffffffffa4;
}

Assistant:

static int default_setup_cipher(quicly_crypto_engine_t *engine, quicly_conn_t *conn, size_t epoch, int is_enc,
                                ptls_cipher_context_t **hp_ctx, ptls_aead_context_t **aead_ctx, ptls_aead_algorithm_t *aead,
                                ptls_hash_algorithm_t *hash, const void *secret)
{
    uint8_t hpkey[PTLS_MAX_SECRET_SIZE];
    int ret;

    if (hp_ctx != NULL)
        *hp_ctx = NULL;
    *aead_ctx = NULL;

    /* generate new header protection key */
    if (hp_ctx != NULL) {
        if ((ret = ptls_hkdf_expand_label(hash, hpkey, aead->ctr_cipher->key_size, ptls_iovec_init(secret, hash->digest_size),
                                          "quic hp", ptls_iovec_init(NULL, 0), NULL)) != 0)
            goto Exit;
        if ((*hp_ctx = ptls_cipher_new(aead->ctr_cipher, is_enc, hpkey)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
    }

    /* generate new AEAD context */
    if ((*aead_ctx = ptls_aead_new(aead, hash, is_enc, secret, QUICLY_AEAD_BASE_LABEL)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (QUICLY_DEBUG) {
        char *secret_hex = quicly_hexdump(secret, hash->digest_size, SIZE_MAX),
             *hpkey_hex = quicly_hexdump(hpkey, aead->ctr_cipher->key_size, SIZE_MAX);
        fprintf(stderr, "%s:\n  aead-secret: %s\n  hp-key: %s\n", __FUNCTION__, secret_hex, hpkey_hex);
        free(secret_hex);
        free(hpkey_hex);
    }

    ret = 0;
Exit:
    if (ret != 0) {
        if (*aead_ctx != NULL) {
            ptls_aead_free(*aead_ctx);
            *aead_ctx = NULL;
        }
        if (hp_ctx != NULL && *hp_ctx != NULL) {
            ptls_cipher_free(*hp_ctx);
            *hp_ctx = NULL;
        }
    }
    ptls_clear_memory(hpkey, sizeof(hpkey));
    return ret;
}